

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::GELU_x86_fma::forward_inplace(GELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  undefined1 (*pauVar26) [32];
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 extraout_var [60];
  
  if ((this->super_GELU).fast_gelu != 0) {
    iVar22 = bottom_top_blob->c;
    if (0 < (long)iVar22) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar25 = 0;
      do {
        auVar57._8_4_ = 0x38f895d6;
        auVar57._0_8_ = 0x38f895d638f895d6;
        auVar55._8_4_ = 0x3ba059dc;
        auVar55._0_8_ = 0x3ba059dc3ba059dc;
        auVar53._8_4_ = 0x3779434a;
        auVar53._0_8_ = 0x3779434a3779434a;
        auVar47._8_4_ = 0x2a61337e;
        auVar47._0_8_ = 0x2a61337e2a61337e;
        auVar45._8_4_ = 0x41100000;
        auVar45._0_8_ = 0x4110000041100000;
        auVar42._8_4_ = 0x335c0041;
        auVar42._0_8_ = 0x335c0041335c0041;
        auVar37._8_4_ = 0xc1100000;
        auVar37._0_8_ = 0xc1100000c1100000;
        auVar34._8_4_ = 0xaebd37ff;
        auVar34._0_8_ = 0xaebd37ffaebd37ff;
        auVar29._8_4_ = 0xa59f25c0;
        auVar29._0_8_ = 0xa59f25c0a59f25c0;
        auVar57._12_4_ = 0x38f895d6;
        auVar55._12_4_ = 0x3ba059dc;
        auVar53._12_4_ = 0x3779434a;
        auVar47._12_4_ = 0x2a61337e;
        auVar45._12_4_ = 0x41100000;
        auVar42._12_4_ = 0x335c0041;
        auVar37._12_4_ = 0xc1100000;
        auVar34._12_4_ = 0xaebd37ff;
        auVar29._12_4_ = 0xa59f25c0;
        auVar57._16_4_ = 0x38f895d6;
        auVar55._16_4_ = 0x3ba059dc;
        auVar53._16_4_ = 0x3779434a;
        auVar47._16_4_ = 0x2a61337e;
        auVar45._16_4_ = 0x41100000;
        auVar42._16_4_ = 0x335c0041;
        auVar37._16_4_ = 0xc1100000;
        auVar34._16_4_ = 0xaebd37ff;
        auVar29._16_4_ = 0xa59f25c0;
        auVar57._20_4_ = 0x38f895d6;
        auVar55._20_4_ = 0x3ba059dc;
        auVar53._20_4_ = 0x3779434a;
        auVar47._20_4_ = 0x2a61337e;
        auVar45._20_4_ = 0x41100000;
        auVar42._20_4_ = 0x335c0041;
        auVar37._20_4_ = 0xc1100000;
        auVar34._20_4_ = 0xaebd37ff;
        auVar29._20_4_ = 0xa59f25c0;
        auVar57._24_4_ = 0x38f895d6;
        auVar55._24_4_ = 0x3ba059dc;
        auVar53._24_4_ = 0x3779434a;
        auVar47._24_4_ = 0x2a61337e;
        auVar45._24_4_ = 0x41100000;
        auVar42._24_4_ = 0x335c0041;
        auVar37._24_4_ = 0xc1100000;
        auVar34._24_4_ = 0xaebd37ff;
        auVar29._24_4_ = 0xa59f25c0;
        auVar57._28_4_ = 0x38f895d6;
        auVar55._28_4_ = 0x3ba059dc;
        auVar53._28_4_ = 0x3779434a;
        auVar47._28_4_ = 0x2a61337e;
        auVar45._28_4_ = 0x41100000;
        auVar42._28_4_ = 0x335c0041;
        auVar37._28_4_ = 0xc1100000;
        auVar34._28_4_ = 0xaebd37ff;
        auVar29._28_4_ = 0xa59f25c0;
        pauVar26 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar25 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar21 = 0;
        }
        else {
          iVar20 = 7;
          auVar38 = auVar34;
          do {
            auVar1 = *pauVar26;
            fVar2 = auVar1._0_4_;
            fVar4 = auVar1._4_4_;
            fVar6 = auVar1._8_4_;
            fVar8 = auVar1._12_4_;
            fVar10 = auVar1._16_4_;
            fVar12 = auVar1._20_4_;
            fVar14 = auVar1._24_4_;
            auVar16._4_4_ = fVar4 * fVar4 * 0.044715;
            auVar16._0_4_ = fVar2 * fVar2 * 0.044715;
            auVar16._8_4_ = fVar6 * fVar6 * 0.044715;
            auVar16._12_4_ = fVar8 * fVar8 * 0.044715;
            auVar16._16_4_ = fVar10 * fVar10 * 0.044715;
            auVar16._20_4_ = fVar12 * fVar12 * 0.044715;
            auVar16._24_4_ = fVar14 * fVar14 * 0.044715;
            auVar16._28_4_ = auVar38._28_4_;
            auVar43 = vfmadd213ps_fma(auVar16,auVar1,auVar1);
            auVar38 = vmaxps_avx(auVar37,ZEXT1632(CONCAT412(auVar43._12_4_ * 0.7978845,
                                                            CONCAT48(auVar43._8_4_ * 0.7978845,
                                                                     CONCAT44(auVar43._4_4_ *
                                                                              0.7978845,
                                                                              auVar43._0_4_ *
                                                                              0.7978845)))));
            auVar38 = vminps_avx(auVar45,auVar38);
            fVar3 = auVar38._0_4_;
            fVar5 = auVar38._4_4_;
            auVar19._4_4_ = fVar5 * fVar5;
            auVar19._0_4_ = fVar3 * fVar3;
            fVar7 = auVar38._8_4_;
            auVar19._8_4_ = fVar7 * fVar7;
            fVar9 = auVar38._12_4_;
            auVar19._12_4_ = fVar9 * fVar9;
            fVar11 = auVar38._16_4_;
            auVar19._16_4_ = fVar11 * fVar11;
            fVar13 = auVar38._20_4_;
            auVar19._20_4_ = fVar13 * fVar13;
            fVar15 = auVar38._24_4_;
            auVar19._24_4_ = fVar15 * fVar15;
            auVar19._28_4_ = 0x3f4c4229;
            auVar43 = vfmadd213ps_fma(auVar29,auVar19,auVar47);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar34);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar42);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar53);
            auVar39._8_4_ = 0x3a270ded;
            auVar39._0_8_ = 0x3a270ded3a270ded;
            auVar39._12_4_ = 0x3a270ded;
            auVar39._16_4_ = 0x3a270ded;
            auVar39._20_4_ = 0x3a270ded;
            auVar39._24_4_ = 0x3a270ded;
            auVar39._28_4_ = 0x3a270ded;
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar39);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar55);
            auVar17._4_4_ = auVar43._4_4_ * fVar5;
            auVar17._0_4_ = auVar43._0_4_ * fVar3;
            auVar17._8_4_ = auVar43._8_4_ * fVar7;
            auVar17._12_4_ = auVar43._12_4_ * fVar9;
            auVar17._16_4_ = fVar11 * 0.0;
            auVar17._20_4_ = fVar13 * 0.0;
            auVar17._24_4_ = fVar15 * 0.0;
            auVar17._28_4_ = auVar38._28_4_;
            auVar38._8_4_ = 0x35a0d3d8;
            auVar38._0_8_ = 0x35a0d3d835a0d3d8;
            auVar38._12_4_ = 0x35a0d3d8;
            auVar38._16_4_ = 0x35a0d3d8;
            auVar38._20_4_ = 0x35a0d3d8;
            auVar38._24_4_ = 0x35a0d3d8;
            auVar38._28_4_ = 0x35a0d3d8;
            auVar43 = vfmadd213ps_fma(auVar38,auVar19,auVar57);
            auVar40._8_4_ = 0x3b14aa05;
            auVar40._0_8_ = 0x3b14aa053b14aa05;
            auVar40._12_4_ = 0x3b14aa05;
            auVar40._16_4_ = 0x3b14aa05;
            auVar40._20_4_ = 0x3b14aa05;
            auVar40._24_4_ = 0x3b14aa05;
            auVar40._28_4_ = 0x3b14aa05;
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar40);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar19,auVar55);
            auVar38 = vdivps_avx(auVar17,ZEXT1632(auVar43));
            auVar18._4_4_ = fVar4 * 0.5;
            auVar18._0_4_ = fVar2 * 0.5;
            auVar18._8_4_ = fVar6 * 0.5;
            auVar18._12_4_ = fVar8 * 0.5;
            auVar18._16_4_ = fVar10 * 0.5;
            auVar18._20_4_ = fVar12 * 0.5;
            auVar18._24_4_ = fVar14 * 0.5;
            auVar18._28_4_ = auVar1._28_4_;
            auVar43 = vfmadd213ps_fma(auVar18,auVar38,auVar18);
            *pauVar26 = ZEXT1632(auVar43);
            pauVar26 = pauVar26 + 1;
            iVar20 = iVar20 + 8;
            uVar21 = uVar24 & 0xfffffff8;
          } while (iVar20 < (int)uVar24);
        }
        auVar43._8_4_ = 0xc1100000;
        auVar43._0_8_ = 0xc1100000c1100000;
        auVar43._12_4_ = 0xc1100000;
        auVar44._8_4_ = 0x41100000;
        auVar44._0_8_ = 0x4110000041100000;
        auVar44._12_4_ = 0x41100000;
        auVar46._8_4_ = 0x2a61337e;
        auVar46._0_8_ = 0x2a61337e2a61337e;
        auVar46._12_4_ = 0x2a61337e;
        auVar48._8_4_ = 0xa59f25c0;
        auVar48._0_8_ = 0xa59f25c0a59f25c0;
        auVar48._12_4_ = 0xa59f25c0;
        auVar49._8_4_ = 0xaebd37ff;
        auVar49._0_8_ = 0xaebd37ffaebd37ff;
        auVar49._12_4_ = 0xaebd37ff;
        auVar50._8_4_ = 0x335c0041;
        auVar50._0_8_ = 0x335c0041335c0041;
        auVar50._12_4_ = 0x335c0041;
        auVar51._8_4_ = 0x3779434a;
        auVar51._0_8_ = 0x3779434a3779434a;
        auVar51._12_4_ = 0x3779434a;
        auVar52._8_4_ = 0x3a270ded;
        auVar52._0_8_ = 0x3a270ded3a270ded;
        auVar52._12_4_ = 0x3a270ded;
        auVar54._8_4_ = 0x3ba059dc;
        auVar54._0_8_ = 0x3ba059dc3ba059dc;
        auVar54._12_4_ = 0x3ba059dc;
        auVar56._8_4_ = 0x38f895d6;
        auVar56._0_8_ = 0x38f895d638f895d6;
        auVar56._12_4_ = 0x38f895d6;
        uVar23 = uVar21 | 3;
        while ((int)uVar23 < (int)uVar24) {
          auVar36 = *(undefined1 (*) [16])*pauVar26;
          fVar2 = auVar36._0_4_;
          fVar4 = auVar36._4_4_;
          fVar6 = auVar36._8_4_;
          fVar8 = auVar36._12_4_;
          auVar31._0_4_ = fVar2 * fVar2 * 0.044715;
          auVar31._4_4_ = fVar4 * fVar4 * 0.044715;
          auVar31._8_4_ = fVar6 * fVar6 * 0.044715;
          auVar31._12_4_ = fVar8 * fVar8 * 0.044715;
          auVar36 = vfmadd213ps_fma(auVar31,auVar36,auVar36);
          auVar32._0_4_ = auVar36._0_4_ * 0.7978845;
          auVar32._4_4_ = auVar36._4_4_ * 0.7978845;
          auVar32._8_4_ = auVar36._8_4_ * 0.7978845;
          auVar32._12_4_ = auVar36._12_4_ * 0.7978845;
          auVar36 = vmaxps_avx(auVar43,auVar32);
          auVar36 = vminps_avx(auVar44,auVar36);
          fVar3 = auVar36._0_4_;
          auVar35._0_4_ = fVar3 * fVar3;
          fVar5 = auVar36._4_4_;
          auVar35._4_4_ = fVar5 * fVar5;
          fVar7 = auVar36._8_4_;
          auVar35._8_4_ = fVar7 * fVar7;
          fVar9 = auVar36._12_4_;
          auVar35._12_4_ = fVar9 * fVar9;
          auVar36 = vfmadd213ps_fma(auVar48,auVar35,auVar46);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar49);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar50);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar51);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar52);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar54);
          auVar33._0_4_ = auVar36._0_4_ * fVar3;
          auVar33._4_4_ = auVar36._4_4_ * fVar5;
          auVar33._8_4_ = auVar36._8_4_ * fVar7;
          auVar33._12_4_ = auVar36._12_4_ * fVar9;
          auVar36._8_4_ = 0x35a0d3d8;
          auVar36._0_8_ = 0x35a0d3d835a0d3d8;
          auVar36._12_4_ = 0x35a0d3d8;
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar56);
          auVar41._8_4_ = 0x3b14aa05;
          auVar41._0_8_ = 0x3b14aa053b14aa05;
          auVar41._12_4_ = 0x3b14aa05;
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar41);
          auVar36 = vfmadd213ps_fma(auVar36,auVar35,auVar54);
          auVar36 = vdivps_avx(auVar33,auVar36);
          auVar28._0_4_ = fVar2 * 0.5;
          auVar28._4_4_ = fVar4 * 0.5;
          auVar28._8_4_ = fVar6 * 0.5;
          auVar28._12_4_ = fVar8 * 0.5;
          auVar36 = vfmadd213ps_fma(auVar28,auVar36,auVar28);
          *(undefined1 (*) [16])*pauVar26 = auVar36;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
          uVar23 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        if (uVar24 - uVar21 != 0 && (int)uVar21 <= (int)uVar24) {
          lVar27 = 0;
          do {
            fVar2 = *(float *)(*pauVar26 + lVar27 * 4);
            auVar43 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 * 0.044715)),ZEXT416((uint)fVar2)
                                      ,ZEXT416((uint)fVar2));
            auVar30._0_4_ = tanhf(auVar43._0_4_ * 0.7978845);
            auVar30._4_60_ = extraout_var;
            auVar43 = vfmadd213ss_fma(auVar30._0_16_,ZEXT416((uint)(fVar2 * 0.5)),
                                      ZEXT416((uint)(fVar2 * 0.5)));
            *(int *)(*pauVar26 + lVar27 * 4) = auVar43._0_4_;
            lVar27 = lVar27 + 1;
          } while (uVar24 - uVar21 != (int)lVar27);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != iVar22);
    }
    return 0;
  }
  iVar22 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
  return iVar22;
}

Assistant:

int GELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}